

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderLinkageTests::init(ShaderLinkageTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ShaderLibraryGroup *pSVar1;
  
  pSVar1 = (ShaderLibraryGroup *)operator_new(0x88);
  ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar1,(this->super_TestCaseGroup).m_context,"es31","GLSL ES 3.1 Linkage",6,
             init::s_filesES31);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  pSVar1 = (ShaderLibraryGroup *)operator_new(0x88);
  ShaderLibraryGroup::ShaderLibraryGroup
            (pSVar1,(this->super_TestCaseGroup).m_context,"es32","GLSL ES 3.2 Linkage",6,
             init::s_filesES32);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		static const ShaderLibraryGroup::File	s_filesES31[]	=
		{
			{ "shaders/es31/linkage_geometry.test",					"geometry",					"Geometry shader"					},
			{ "shaders/es31/linkage_tessellation.test",				"tessellation",				"Tessellation shader"				},
			{ "shaders/es31/linkage_tessellation_geometry.test",	"tessellation_geometry",	"Tessellation and geometry shader"	},
			{ "shaders/es31/linkage_shader_storage_block.test",		"shader_storage_block",		"Shader storage blocks"				},
			{ "shaders/es31/linkage_io_block.test",					"io_block",					"Shader io blocks"					},
			{ "shaders/es31/linkage_uniform.test",					"uniform",					"Uniform linkage"					},
		};
		static const ShaderLibraryGroup::File	s_filesES32[]	=
		{
			{ "shaders/es32/linkage_geometry.test",					"geometry",					"Geometry shader"					},
			{ "shaders/es32/linkage_tessellation.test",				"tessellation",				"Tessellation shader"				},
			{ "shaders/es32/linkage_tessellation_geometry.test",	"tessellation_geometry",	"Tessellation and geometry shader"	},
			{ "shaders/es32/linkage_shader_storage_block.test",		"shader_storage_block",		"Shader storage blocks"				},
			{ "shaders/es32/linkage_io_block.test",					"io_block",					"Shader io blocks"					},
			{ "shaders/es32/linkage_uniform.test",					"uniform",					"Uniform linkage"					},
		};

		addChild(new ShaderLibraryGroup(m_context,	"es31",		"GLSL ES 3.1 Linkage",	DE_LENGTH_OF_ARRAY(s_filesES31), s_filesES31));
		addChild(new ShaderLibraryGroup(m_context,	"es32",		"GLSL ES 3.2 Linkage",	DE_LENGTH_OF_ARRAY(s_filesES32), s_filesES32));
	}